

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::
TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
add_sample(TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,double t,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v)

{
  undefined1 local_50 [8];
  Sample s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_local;
  double t_local;
  TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  s._40_8_ = v;
  Sample::Sample((Sample *)local_50);
  local_50 = (undefined1  [8])t;
  ::std::__cxx11::string::operator=((string *)&s,(string *)s._40_8_);
  ::std::
  vector<tinyusdz::TypedTimeSamples<std::__cxx11::string>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::string>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<std::__cxx11::string>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<std::__cxx11::string>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::string>::Sample>>
              *)this,(Sample *)local_50);
  this->_dirty = true;
  Sample::~Sample((Sample *)local_50);
  return;
}

Assistant:

void add_sample(const double t, const T &v) {
    Sample s;
    s.t = t;
    s.value = v;
    _samples.emplace_back(s);
    _dirty = true;
  }